

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

void Abc_GenFsmCond(Vec_Str_t *vCond,int nPis,int Prob)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  char *pcVar5;
  char cVar6;
  
  vCond->nSize = 0;
  if (nPis < 1) {
    if (vCond->nCap != 0) goto LAB_002d29e3;
  }
  else {
    do {
      uVar4 = Aig_ManRandom(0);
      if (Prob < (int)uVar4 % 100) {
        uVar4 = vCond->nSize;
        if (uVar4 == vCond->nCap) {
          if ((int)uVar4 < 0x10) {
            if (vCond->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(0x10);
            }
            else {
              pcVar5 = (char *)realloc(vCond->pArray,0x10);
            }
            vCond->pArray = pcVar5;
            vCond->nCap = 0x10;
          }
          else {
            sVar3 = (ulong)uVar4 * 2;
            if (vCond->pArray == (char *)0x0) {
              pcVar5 = (char *)malloc(sVar3);
            }
            else {
              pcVar5 = (char *)realloc(vCond->pArray,sVar3);
            }
            vCond->pArray = pcVar5;
            vCond->nCap = (int)sVar3;
          }
        }
        else {
          pcVar5 = vCond->pArray;
        }
        cVar6 = '-';
      }
      else {
        uVar1 = vCond->nSize;
        if ((uVar4 & 1) == 0) {
          if (uVar1 == vCond->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vCond->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(vCond->pArray,0x10);
              }
              vCond->pArray = pcVar5;
              vCond->nCap = 0x10;
            }
            else {
              sVar3 = (ulong)uVar1 * 2;
              if (vCond->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar3);
              }
              else {
                pcVar5 = (char *)realloc(vCond->pArray,sVar3);
              }
              vCond->pArray = pcVar5;
              vCond->nCap = (int)sVar3;
            }
          }
          else {
            pcVar5 = vCond->pArray;
          }
          cVar6 = '0';
        }
        else {
          if (uVar1 == vCond->nCap) {
            if ((int)uVar1 < 0x10) {
              if (vCond->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(0x10);
              }
              else {
                pcVar5 = (char *)realloc(vCond->pArray,0x10);
              }
              vCond->pArray = pcVar5;
              vCond->nCap = 0x10;
            }
            else {
              sVar3 = (ulong)uVar1 * 2;
              if (vCond->pArray == (char *)0x0) {
                pcVar5 = (char *)malloc(sVar3);
              }
              else {
                pcVar5 = (char *)realloc(vCond->pArray,sVar3);
              }
              vCond->pArray = pcVar5;
              vCond->nCap = (int)sVar3;
            }
          }
          else {
            pcVar5 = vCond->pArray;
          }
          cVar6 = '1';
        }
      }
      iVar2 = vCond->nSize;
      vCond->nSize = iVar2 + 1;
      pcVar5[iVar2] = cVar6;
      nPis = nPis + -1;
    } while (nPis != 0);
    uVar4 = vCond->nSize;
    if (uVar4 != vCond->nCap) {
LAB_002d29e3:
      pcVar5 = vCond->pArray;
      goto LAB_002d2a23;
    }
    if (0xf < (int)uVar4) {
      sVar3 = (ulong)uVar4 * 2;
      if (vCond->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar3);
      }
      else {
        pcVar5 = (char *)realloc(vCond->pArray,sVar3);
      }
      vCond->pArray = pcVar5;
      vCond->nCap = (int)sVar3;
      goto LAB_002d2a23;
    }
  }
  if (vCond->pArray == (char *)0x0) {
    pcVar5 = (char *)malloc(0x10);
  }
  else {
    pcVar5 = (char *)realloc(vCond->pArray,0x10);
  }
  vCond->pArray = pcVar5;
  vCond->nCap = 0x10;
LAB_002d2a23:
  iVar2 = vCond->nSize;
  vCond->nSize = iVar2 + 1;
  pcVar5[iVar2] = '\0';
  return;
}

Assistant:

void Abc_GenFsmCond( Vec_Str_t * vCond, int nPis, int Prob )
{
    int i, Rand;
    Vec_StrClear( vCond );
    for ( i = 0; i < nPis; i++ )
    {
        Rand = Aig_ManRandom( 0 );
        if ( Rand % 100 > Prob )
            Vec_StrPush( vCond, '-' );
        else if ( Rand & 1 )
            Vec_StrPush( vCond, '1' );
        else
            Vec_StrPush( vCond, '0' );
    }
    Vec_StrPush( vCond, '\0' );
}